

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

void R_DrawSlabC(int dx,fixed_t v,int dy,fixed_t vi,BYTE *vptr,BYTE *p)

{
  BYTE BVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  long lVar4;
  int iVar5;
  
  pBVar2 = slabcolormap;
  if (dx < 1) {
    __assert_fail("dx > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_draw.cpp"
                  ,0x5dd,"void R_DrawSlabC(int, fixed_t, int, fixed_t, const BYTE *, BYTE *)");
  }
  lVar4 = (long)dc_pitch;
  switch(dx) {
  case 1:
    if (0 < dy) {
      iVar5 = dy + 1;
      do {
        *p = pBVar2[vptr[v >> 0x10]];
        p = p + lVar4;
        v = v + vi;
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
    break;
  case 2:
    if (0 < dy) {
      iVar5 = dy + 1;
      pBVar3 = p + 1;
      do {
        BVar1 = pBVar2[vptr[v >> 0x10]];
        pBVar3[-1] = BVar1;
        *pBVar3 = BVar1;
        v = v + vi;
        iVar5 = iVar5 + -1;
        pBVar3 = pBVar3 + lVar4;
      } while (1 < iVar5);
    }
    break;
  case 3:
    if (0 < dy) {
      iVar5 = dy + 1;
      pBVar3 = p + 2;
      do {
        BVar1 = pBVar2[vptr[v >> 0x10]];
        pBVar3[-2] = BVar1;
        pBVar3[-1] = BVar1;
        *pBVar3 = BVar1;
        v = v + vi;
        iVar5 = iVar5 + -1;
        pBVar3 = pBVar3 + lVar4;
      } while (1 < iVar5);
    }
    break;
  case 4:
    if (0 < dy) {
      iVar5 = dy + 1;
      pBVar3 = p + 3;
      do {
        BVar1 = pBVar2[vptr[v >> 0x10]];
        pBVar3[-3] = BVar1;
        pBVar3[-2] = BVar1;
        pBVar3[-1] = BVar1;
        *pBVar3 = BVar1;
        v = v + vi;
        iVar5 = iVar5 + -1;
        pBVar3 = pBVar3 + lVar4;
      } while (1 < iVar5);
    }
    break;
  default:
    if (0 < dy) {
      iVar5 = dy + 1;
      do {
        memset(p,(uint)pBVar2[vptr[v >> 0x10]],(ulong)(uint)dx);
        p = p + lVar4;
        v = v + vi;
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
  }
  return;
}

Assistant:

void R_DrawSlabC(int dx, fixed_t v, int dy, fixed_t vi, const BYTE *vptr, BYTE *p)
{
	int x;
	const BYTE *colormap = slabcolormap;
	int pitch = dc_pitch;

	assert(dx > 0);

	if (dx == 1)
	{
		while (dy > 0)
		{
			*p = colormap[vptr[v >> FRACBITS]];
			p += pitch;
			v += vi;
			dy--;
		}
	}
	else if (dx == 2)
	{
		while (dy > 0)
		{
			BYTE color = colormap[vptr[v >> FRACBITS]];
			p[0] = color;
			p[1] = color;
			p += pitch;
			v += vi;
			dy--;
		}
	}
	else if (dx == 3)
	{
		while (dy > 0)
		{
			BYTE color = colormap[vptr[v >> FRACBITS]];
			p[0] = color;
			p[1] = color;
			p[2] = color;
			p += pitch;
			v += vi;
			dy--;
		}
	}
	else if (dx == 4)
	{
		while (dy > 0)
		{
			BYTE color = colormap[vptr[v >> FRACBITS]];
			p[0] = color;
			p[1] = color;
			p[2] = color;
			p[3] = color;
			p += pitch;
			v += vi;
			dy--;
		}
	}
	else while (dy > 0)
	{
		BYTE color = colormap[vptr[v >> FRACBITS]];
		// The optimizer will probably turn this into a memset call.
		// Since dx is not likely to be large, I'm not sure that's a good thing,
		// hence the alternatives above.
		for (x = 0; x < dx; x++)
		{
			p[x] = color;
		}
		p += pitch;
		v += vi;
		dy--;
	}
}